

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O2

int flikam(double *P,int MP,double *Q,int MQ,double *W,double *E,int N,double *ssq,double *fact,
          double *VW,double *VL,int MRP1,double *VK,int MR,double TOLER)

{
  double dVar1;
  int MXPQ;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  double *pdVar10;
  double *pdVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double __x;
  double dVar24;
  int local_6c;
  
  uVar17 = (ulong)(uint)MQ;
  *fact = 0.0;
  *ssq = 0.0;
  MXPQ = imax(MP,MQ);
  iVar2 = twacf(P,MP,Q,MQ,VW,MXPQ + 1,VL,MXPQ + 1,VK,MXPQ);
  iVar3 = imax(MP,MQ + 1);
  iVar16 = 6;
  if (iVar3 == MR) {
    iVar16 = iVar2;
  }
  local_6c = 7;
  if (MR + 1 == MRP1) {
    local_6c = iVar16;
  }
  if (0 < local_6c) {
    return local_6c;
  }
  dVar24 = *VW;
  *VK = dVar24;
  lVar18 = (long)MP;
  if (MR != 1) {
    lVar8 = (ulong)(MQ + 2) - 2;
    pdVar11 = Q;
    pdVar10 = P;
    for (lVar7 = 2; pdVar10 = pdVar10 + 1, lVar7 <= MR; lVar7 = lVar7 + 1) {
      VK[lVar7 + -1] = 0.0;
      dVar24 = 0.0;
      if (lVar7 <= lVar18) {
        for (lVar14 = 0; lVar7 + lVar14 <= lVar18; lVar14 = lVar14 + 1) {
          dVar24 = dVar24 + pdVar10[lVar14] * VW[lVar14 + 1];
          VK[lVar7 + -1] = dVar24;
        }
      }
      if (lVar7 <= MQ + 1) {
        for (lVar14 = 0; lVar8 != lVar14; lVar14 = lVar14 + 1) {
          dVar24 = dVar24 - pdVar11[lVar14] * VL[lVar14];
          VK[lVar7 + -1] = dVar24;
        }
      }
      lVar8 = lVar8 + -1;
      pdVar11 = pdVar11 + 1;
    }
    dVar24 = *VK;
  }
  iVar16 = MP + 1;
  VL[(long)MR + -1] = 0.0;
  uVar5 = 0;
  uVar15 = (ulong)(uint)MR;
  if (MR < 1) {
    uVar15 = uVar5;
  }
  for (; uVar15 != uVar5; uVar5 = uVar5 + 1) {
    VW[uVar5] = 0.0;
    if (MR - 1 != uVar5) {
      VL[uVar5] = VK[uVar5 + 1];
    }
    if ((long)uVar5 < lVar18) {
      dVar19 = P[uVar5] * dVar24 + VL[uVar5];
      VL[uVar5] = dVar19;
    }
    else {
      dVar19 = VL[uVar5];
    }
    VK[uVar5] = dVar19;
  }
  VW[lVar18] = 0.0;
  VL[MXPQ] = 0.0;
  if (N < 1) {
    return 9;
  }
  uVar5 = (ulong)(uint)(iVar16 - MQ);
  uVar12 = (ulong)(N + 1);
  dVar19 = 0.0;
  __x = 1.0;
  uVar4 = MP;
  for (uVar15 = 1; uVar15 != uVar12; uVar15 = uVar15 + 1) {
    if (uVar15 == uVar5) {
      uVar4 = imin(MP,MQ);
      uVar6 = uVar5;
      uVar9 = uVar5;
      if (MQ < 1) goto LAB_0011761d;
      iVar16 = uVar4 + 1;
    }
    if (dVar24 <= 1e-10) {
      return 8;
    }
    if (((long)MXPQ < (long)uVar15) && (uVar6 = uVar15, uVar9 = uVar15, ABS(dVar24 + -1.0) < TOLER))
    goto LAB_0011761d;
    for (__x = __x * dVar24; 1.0 <= ABS(__x); __x = __x * 0.0625) {
      dVar19 = dVar19 + 4.0;
    }
    for (; ABS(__x) < 0.0625; __x = __x * 16.0) {
      dVar19 = dVar19 + -4.0;
    }
    dVar1 = *VW;
    dVar22 = W[uVar15 - 1];
    if (dVar24 < 0.0) {
      dVar20 = sqrt(dVar24);
    }
    else {
      dVar20 = SQRT(dVar24);
    }
    dVar22 = dVar22 - dVar1;
    E[uVar15 - 1] = dVar22 / dVar20;
    dVar21 = dVar22 / dVar24;
    *ssq = dVar22 * dVar21 + *ssq;
    dVar22 = *VL;
    dVar20 = -dVar22 / dVar24;
    if (uVar4 != 0) {
      uVar6 = 0;
      if (0 < (int)uVar4) {
        uVar6 = (ulong)uVar4;
      }
      for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
        dVar23 = P[uVar9] * dVar22 + VL[uVar9 + 1];
        VW[uVar9] = VK[uVar9] * dVar21 + P[uVar9] * dVar1 + VW[uVar9 + 1];
        VL[uVar9] = VK[uVar9] * dVar20 + dVar23;
        VK[uVar9] = dVar23 * dVar20 + VK[uVar9];
      }
    }
    if (iVar16 <= MQ) {
      for (lVar7 = (long)iVar16; lVar7 <= MQ; lVar7 = lVar7 + 1) {
        VW[lVar7 + -1] = VK[lVar7 + -1] * dVar21 + VW[lVar7];
        VL[lVar7 + -1] = VK[lVar7 + -1] * dVar20 + VL[lVar7];
        VK[lVar7 + -1] = VL[lVar7] * dVar20 + VK[lVar7 + -1];
      }
    }
    if (iVar16 <= MP) {
      for (lVar7 = (long)iVar16; lVar7 <= lVar18; lVar7 = lVar7 + 1) {
        VW[lVar7 + -1] = P[lVar7 + -1] * W[uVar15 - 1] + VW[lVar7];
      }
    }
    dVar24 = dVar24 + dVar20 * dVar22;
  }
LAB_0011775f:
  dVar24 = pow(__x,1.0 / (double)N);
  dVar19 = exp2(dVar19 / (double)N);
  *fact = dVar19 * dVar24;
  return local_6c;
LAB_0011761d:
  for (; uVar12 != uVar6; uVar6 = uVar6 + 1) {
    E[uVar6 - 1] = W[uVar6 - 1];
  }
  if (MP != 0) {
    uVar5 = (ulong)(uint)MP;
    if (MP < 1) {
      uVar5 = 0;
    }
    lVar18 = (uVar9 << 0x20) + -0x200000000;
    for (uVar6 = uVar9; uVar6 != uVar12; uVar6 = uVar6 + 1) {
      lVar7 = lVar18;
      for (uVar13 = 0; uVar5 != uVar13; uVar13 = uVar13 + 1) {
        E[uVar6 - 1] = E[uVar6 - 1] - P[uVar13] * *(double *)((long)W + (lVar7 >> 0x1d));
        lVar7 = lVar7 + -0x100000000;
      }
      lVar18 = lVar18 + 0x100000000;
    }
  }
  if (MQ != 0) {
    if (MQ < 1) {
      uVar17 = 0;
    }
    lVar18 = (uVar9 << 0x20) + -0x200000000;
    for (uVar5 = uVar9; uVar5 != uVar12; uVar5 = uVar5 + 1) {
      lVar7 = lVar18;
      for (uVar6 = 0; uVar17 != uVar6; uVar6 = uVar6 + 1) {
        E[uVar5 - 1] = Q[uVar6] * *(double *)((long)E + (lVar7 >> 0x1d)) + E[uVar5 - 1];
        lVar7 = lVar7 + -0x100000000;
      }
      lVar18 = lVar18 + 0x100000000;
    }
  }
  local_6c = -(int)uVar15;
  for (; uVar12 != uVar9; uVar9 = uVar9 + 1) {
    *ssq = E[uVar9 - 1] * E[uVar9 - 1] + *ssq;
  }
  goto LAB_0011775f;
}

Assistant:

int flikam(double *P, int MP, double *Q, int MQ,double *W, double *E, int N,double *ssq,double *fact,double *VW,double *VL,int MRP1,double *VK,int MR,double TOLER) {
	int ifault,MXPQ,MXPQP1,MQP1,MPP1,FLAG;
	int k,j,jp2mk,jp1mk,LAST,LOOP,JFROM,i,NEXTI,imj;
	double zero, p0625, one, two, four, sixteen,epsil1;
	double A, ALF, AOR, DETCAR, DETMAN, FLJ, R, VL1, VW1;

	zero = 0.0; p0625 = 0.0625; one = 1.0; two = 2.0; four = 4.0; sixteen = 16.0;
	epsil1 = 1.0e-10;

	*ssq = *fact = zero;
	DETMAN = one;
	DETCAR = zero;
	MXPQ = imax(MP, MQ);// Check
	MXPQP1 = MXPQ + 1;
	MQP1 = MQ + 1;
	MPP1 = MP + 1;
	FLAG = 0;

	ifault = twacf(P, MP,Q, MQ,VW,MXPQP1,VL, MXPQP1,VK,MXPQ);
	if (MR != imax(MP, MQP1)) {
		ifault = 6;
	}
	if (MRP1 != MR + 1) {
		ifault = 7;
	}

	if (ifault > 0) {
		return ifault;
	}

	VK[0] = VW[0];

	if (MR != 1) {
		for (k = 2; k <= MR; ++k) {
			VK[k - 1] = zero;
			if (k <= MP) {
				for (j = k; j <= MP; ++j) {
					jp2mk = j + 2 - k;
					VK[k - 1] += P[j - 1] * VW[jp2mk - 1];
				}
			}//120
			if (k <= MQP1) {
				for (j = k; j <= MQP1; ++j) {
					jp1mk = j + 1 - k;
					VK[k - 1] -= Q[j - 2] * VL[jp1mk - 1];
				}
			}
		}
	}//150

	R = VK[0];
	VL[MR - 1] = zero;
	for (j = 0; j < MR; ++j) {
		VW[j] = zero;
		if (j != MR - 1) {
			VL[j] = VK[j + 1];
		}
		if (j <= MP - 1) {
			VL[j] += P[j] * R;
		}
		VK[j] = VL[j];
	}

	LAST = MPP1 - MQ;
	LOOP = MP;
	JFROM = MPP1;
	VW[MPP1-1] = zero;
	VL[MXPQP1-1] = zero;

	if (N <= 0) {
		return 9;
	}

	for (i = 1; i <= N; ++i) {
		if (i == LAST) {
			LOOP = imin(MP, MQ);
			JFROM = LOOP + 1;
			if (MQ <= 0) {
				FLAG = 1;
				break;
			}
		}
		if (R <= epsil1) {
			return 8;
		}
		if (fabs(R - one) < TOLER && i > MXPQ) {
			FLAG = 1;
			break;
		}
		DETMAN *= R;
		while (fabs(DETMAN) >= one) {
			DETMAN *= p0625;
			DETCAR += four;
		}
		while (fabs(DETMAN) < p0625) {
			DETMAN *= sixteen;
			DETCAR -= four;
		}
		VW1 = VW[0];
		A = W[i - 1] - VW1;
		E[i - 1] = A / sqrt(R);
		AOR = A / R;
		*ssq += A*AOR;
		VL1 = VL[0];
		ALF = VL1 / R;
		R -= ALF * VL1;
		if (LOOP != 0) {
			for (j = 0; j < LOOP; ++j) {
				FLJ = VL[j + 1] + P[j] * VL1;
				VW[j] = VW[j + 1] + P[j] * VW1 + AOR * VK[j];
				VL[j] = FLJ - ALF * VK[j];
				VK[j] -= ALF * FLJ;
			}
		}

		if (JFROM <= MQ) {
			for (j = JFROM; j <= MQ; ++j) {
				VW[j - 1] = VW[j] + AOR * VK[j - 1];
				VL[j - 1] = VL[j] - ALF * VK[j - 1];
				VK[j - 1] -= ALF*VL[j];
			}
		}
		if (JFROM <= MP) {
			for (j = JFROM; j <= MP; ++j) {
				VW[j - 1] = VW[j] + P[j-1] * W[i-1];
			}
		}
	}

	if (FLAG == 1) {
		NEXTI = i;
		ifault = -NEXTI;
		for (i = NEXTI; i <= N; ++i) {
			E[i - 1] = W[i - 1];
		}
		if (MP != 0) {
			for (i = NEXTI; i <= N; ++i) {
				for (j = 1; j <= MP; ++j) {
					imj = i - j;
					E[i - 1] -= P[j - 1] * W[imj - 1];
				}
			}
		}//340
		if (MQ != 0) {
			for (i = NEXTI; i <= N; ++i) {
				for (j = 1; j <= MQ; ++j) {
					imj = i - j;
					E[i - 1] += Q[j - 1] * E[imj - 1];
				}
			}
		}
		for (i = NEXTI; i <= N; ++i) {
			*ssq += E[i - 1] * E[i - 1];
		}
	}
	/*
	mdisplay(VW, 1, MRP1);
	mdisplay(VL, 1, MRP1);
	mdisplay(VK, 1, MR);
	*/
	*fact = pow(DETMAN, one / (double)N) * pow(two, DETCAR / (double)N);

	return ifault;
}